

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

void ma_device__on_notification(ma_device_notification notification)

{
  undefined1 local_18 [8];
  ma_device_notification notification_local;
  
  notification_local.pDevice = notification._8_8_;
  local_18 = (undefined1  [8])notification.pDevice;
  if (local_18 != (undefined1  [8])0x0) {
    if (((ma_device *)local_18)->onNotification != (ma_device_notification_proc)0x0) {
      (*((ma_device *)local_18)->onNotification)((ma_device_notification *)local_18);
    }
    if ((*(ma_stop_proc *)((long)local_18 + 0x28) != (ma_stop_proc)0x0) &&
       ((int)notification_local.pDevice == 1)) {
      (**(ma_stop_proc *)((long)local_18 + 0x28))((ma_device *)local_18);
    }
    return;
  }
  __assert_fail("notification.pDevice != ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                ,0x1a52,"void ma_device__on_notification(ma_device_notification)");
}

Assistant:

static void ma_device__on_notification(ma_device_notification notification)
{
    MA_ASSERT(notification.pDevice != NULL);

    if (notification.pDevice->onNotification != NULL) {
        notification.pDevice->onNotification(&notification);
    }

    /* TEMP FOR COMPATIBILITY: If it's a stopped notification, fire the onStop callback as well. This is only for backwards compatibility and will be removed. */
    if (notification.pDevice->onStop != NULL && notification.type == ma_device_notification_type_stopped) {
        notification.pDevice->onStop(notification.pDevice);
    }
}